

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

int __thiscall
glcts::ViewportArray::Utils::texture::bind(texture *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  RenderContext *pRVar2;
  int iVar3;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  undefined8 uVar4;
  
  pRVar2 = this->m_context->m_renderCtx;
  iVar3 = (*pRVar2->_vptr_RenderContext[3])
                    (pRVar2,CONCAT44(in_register_00000034,__fd),__addr,
                     CONCAT44(in_register_0000000c,__len));
  bVar1 = this->m_is_array;
  uVar4 = 0x8c1a;
  if (bVar1 == false) {
    uVar4 = 0xde1;
  }
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0xb8))(uVar4,this->m_id);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,(uint)bVar1 + (uint)bVar1 * 4 + 0x2d5);
  return extraout_EAX;
}

Assistant:

void Utils::texture::bind() const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (false == m_is_array)
	{
		gl.bindTexture(GL_TEXTURE_2D, m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
	else
	{
		gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
}